

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

uint32_t convert_miniscript_wrapper_flag(char *wrapper)

{
  char *pcVar1;
  size_t max;
  size_t index;
  uint32_t result;
  char *wrapper_local;
  
  index._4_4_ = 0;
  for (max = 0; max < 10; max = max + 1) {
    pcVar1 = strchr(wrapper,(int)*miniscript_wrapper_table[max].name);
    if (pcVar1 != (char *)0x0) {
      index._4_4_ = miniscript_wrapper_table[max].kind | index._4_4_;
    }
  }
  return index._4_4_;
}

Assistant:

static uint32_t convert_miniscript_wrapper_flag(const char *wrapper)
{
    uint32_t result = 0;
    size_t index;
    size_t max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_wrapper_item_t);

    for (index = 0; index < max; ++index) {
        if (strchr(wrapper, miniscript_wrapper_table[index].name[0]) != NULL) {
            result |= (uint32_t)miniscript_wrapper_table[index].kind;
        }
    }
    return result;
}